

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_bea9::TextureWriterTestHelper<unsigned_char,_4U,_32856U>::compareTexture2Images
          (TextureWriterTestHelper<unsigned_char,_4U,_32856U> *this,ktx_uint8_t *pData)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  undefined8 *puVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  
  pvVar3 = (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).width;
  uVar2 = (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).height;
  uVar9 = (int)((ulong)((long)(this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).images.
                              super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3) *
          -0x55555555;
  while (0 < (int)uVar9) {
    uVar10 = uVar9 - 1;
    bVar5 = (byte)uVar10 & 0x1f;
    uVar8 = (ulong)((uVar1 >> bVar5) * 4);
    if (uVar1 >> bVar5 == 0) {
      uVar8 = 4;
    }
    uVar6 = uVar2 >> ((byte)uVar10 & 0x1f);
    uVar8 = (uVar6 + (uVar6 == 0)) * uVar8;
    lVar11 = (long)*(pointer *)
                    ((long)&(pvVar3->
                            super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data + 8) -
             *(long *)&(pvVar3->
                       super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data;
    bVar17 = lVar11 != 0;
    if (bVar17) {
      uVar12 = (lVar11 >> 3) * -0x5555555555555555;
      lVar11 = *(long *)&pvVar3[uVar10].
                         super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                         ._M_impl;
      uVar16 = 0;
      do {
        puVar4 = *(undefined8 **)(lVar11 + uVar16 * 0x18);
        lVar13 = *(long *)(lVar11 + 8 + uVar16 * 0x18) - (long)puVar4;
        bVar18 = lVar13 != 0;
        if (bVar18) {
          iVar7 = bcmp((void *)*puVar4,pData,puVar4[1] - (long)*puVar4);
          if (iVar7 == 0) {
            uVar14 = (lVar13 >> 3) * -0x5555555555555555;
            uVar6 = 1;
            do {
              pData = pData + uVar8;
              uVar15 = (ulong)uVar6;
              bVar19 = uVar14 - uVar15 == 0;
              bVar18 = uVar14 >= uVar15 && !bVar19;
              if (uVar14 < uVar15 || bVar19) goto LAB_00127735;
              iVar7 = bcmp((void *)puVar4[uVar15 * 3],pData,
                           puVar4[uVar15 * 3 + 1] - (long)puVar4[uVar15 * 3]);
              uVar6 = uVar6 + 1;
            } while (iVar7 == 0);
          }
          if (bVar18) break;
        }
LAB_00127735:
        uVar16 = (ulong)((int)uVar16 + 1);
        bVar17 = uVar16 < uVar12;
      } while (uVar16 < uVar12);
    }
    if (bVar17) break;
    fVar20 = (float)uVar8;
    fVar21 = ceilf(fVar20 * 0.25);
    pData = pData + ((long)(fVar21 * 4.0 - fVar20) & 0xffffffff);
    uVar9 = uVar10;
  }
  return (int)uVar9 < 1;
}

Assistant:

bool
    compareTexture2Images(ktx_uint8_t* pData)
    {
        for (ktx_int32_t level = (ktx_int32_t)images.size() - 1; level >= 0; level--) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t texelBlockSize = sizeof(component_type) * numComponents;
            ktx_uint32_t requiredLevelAlignment = lcm4(texelBlockSize);
            ktx_size_t rowBytes = levelWidth * texelBlockSize;
            ktx_size_t imageBytes = rowBytes * levelHeight;
            for (ktx_uint32_t layer = 0; layer < images[0].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    if (memcmp(images[level][layer][faceSlice].data(), pData,
                               images[level][layer][faceSlice].size() * sizeof(component_type)))
                        return false;
                    pData += imageBytes;
                }
            }
            pData += _KTX_PADN_LEN(requiredLevelAlignment, imageBytes);
        }
        return true;
    }